

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  undefined4 uVar5;
  uint uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  uint uVar51;
  undefined1 (*pauVar52) [16];
  long lVar53;
  ulong uVar54;
  uint uVar55;
  ulong uVar56;
  undefined1 (*pauVar57) [16];
  ulong uVar58;
  long lVar59;
  undefined1 (*pauVar60) [16];
  long lVar61;
  ulong uVar62;
  Scene *pSVar63;
  ulong uVar64;
  ulong uVar65;
  undefined1 (*pauVar66) [16];
  ulong uVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  undefined1 auVar73 [16];
  undefined1 auVar75 [32];
  undefined1 auVar74 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar86 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  float fVar100;
  float fVar101;
  undefined1 auVar97 [16];
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  float fVar115;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar119 [64];
  undefined1 auVar126 [32];
  undefined1 auVar127 [64];
  undefined4 uVar128;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  undefined1 auVar136 [32];
  undefined1 auVar137 [64];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_29e0 [16];
  undefined1 (*local_29d0) [16];
  long local_29c8;
  ulong local_29c0;
  ulong local_29b8;
  RTCFilterFunctionNArguments local_29b0;
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  RTCHitN local_2890 [16];
  undefined1 local_2880 [16];
  undefined1 local_2870 [16];
  undefined1 local_2860 [16];
  undefined4 local_2850;
  undefined4 uStack_284c;
  undefined4 uStack_2848;
  undefined4 uStack_2844;
  undefined1 local_2840 [16];
  undefined1 local_2830 [16];
  uint local_2820;
  uint uStack_281c;
  uint uStack_2818;
  uint uStack_2814;
  uint uStack_2810;
  uint uStack_280c;
  uint uStack_2808;
  uint uStack_2804;
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  float local_26c0 [4];
  float fStack_26b0;
  float fStack_26ac;
  float fStack_26a8;
  undefined4 uStack_26a4;
  float local_26a0 [4];
  float fStack_2690;
  float fStack_268c;
  float fStack_2688;
  undefined4 uStack_2684;
  float local_2680 [4];
  float fStack_2670;
  float fStack_266c;
  float fStack_2668;
  undefined4 uStack_2664;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [8];
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  undefined4 uStack_2504;
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  pauVar52 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar128 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_2540._4_4_ = uVar128;
  local_2540._0_4_ = uVar128;
  local_2540._8_4_ = uVar128;
  local_2540._12_4_ = uVar128;
  local_2540._16_4_ = uVar128;
  local_2540._20_4_ = uVar128;
  local_2540._24_4_ = uVar128;
  local_2540._28_4_ = uVar128;
  auVar108 = ZEXT3264(local_2540);
  uVar128 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_2560._4_4_ = uVar128;
  local_2560._0_4_ = uVar128;
  local_2560._8_4_ = uVar128;
  local_2560._12_4_ = uVar128;
  local_2560._16_4_ = uVar128;
  local_2560._20_4_ = uVar128;
  local_2560._24_4_ = uVar128;
  local_2560._28_4_ = uVar128;
  auVar113 = ZEXT3264(local_2560);
  uVar128 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2580._4_4_ = uVar128;
  local_2580._0_4_ = uVar128;
  local_2580._8_4_ = uVar128;
  local_2580._12_4_ = uVar128;
  local_2580._16_4_ = uVar128;
  local_2580._20_4_ = uVar128;
  local_2580._24_4_ = uVar128;
  local_2580._28_4_ = uVar128;
  auVar114 = ZEXT3264(local_2580);
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar27 = fVar1 * 0.99999964;
  local_25a0._4_4_ = fVar27;
  local_25a0._0_4_ = fVar27;
  local_25a0._8_4_ = fVar27;
  local_25a0._12_4_ = fVar27;
  local_25a0._16_4_ = fVar27;
  local_25a0._20_4_ = fVar27;
  local_25a0._24_4_ = fVar27;
  local_25a0._28_4_ = fVar27;
  auVar119 = ZEXT3264(local_25a0);
  fVar27 = fVar2 * 0.99999964;
  local_25c0._4_4_ = fVar27;
  local_25c0._0_4_ = fVar27;
  local_25c0._8_4_ = fVar27;
  local_25c0._12_4_ = fVar27;
  local_25c0._16_4_ = fVar27;
  local_25c0._20_4_ = fVar27;
  local_25c0._24_4_ = fVar27;
  local_25c0._28_4_ = fVar27;
  auVar127 = ZEXT3264(local_25c0);
  fVar27 = fVar3 * 0.99999964;
  local_25e0._4_4_ = fVar27;
  local_25e0._0_4_ = fVar27;
  local_25e0._8_4_ = fVar27;
  local_25e0._12_4_ = fVar27;
  local_25e0._16_4_ = fVar27;
  local_25e0._20_4_ = fVar27;
  local_25e0._24_4_ = fVar27;
  local_25e0._28_4_ = fVar27;
  auVar132 = ZEXT3264(local_25e0);
  fVar1 = fVar1 * 1.0000004;
  local_2600._4_4_ = fVar1;
  local_2600._0_4_ = fVar1;
  local_2600._8_4_ = fVar1;
  local_2600._12_4_ = fVar1;
  local_2600._16_4_ = fVar1;
  local_2600._20_4_ = fVar1;
  local_2600._24_4_ = fVar1;
  local_2600._28_4_ = fVar1;
  auVar133 = ZEXT3264(local_2600);
  fVar2 = fVar2 * 1.0000004;
  local_2620._4_4_ = fVar2;
  local_2620._0_4_ = fVar2;
  local_2620._8_4_ = fVar2;
  local_2620._12_4_ = fVar2;
  local_2620._16_4_ = fVar2;
  local_2620._20_4_ = fVar2;
  local_2620._24_4_ = fVar2;
  local_2620._28_4_ = fVar2;
  auVar135 = ZEXT3264(local_2620);
  fVar3 = fVar3 * 1.0000004;
  local_2640._4_4_ = fVar3;
  local_2640._0_4_ = fVar3;
  local_2640._8_4_ = fVar3;
  local_2640._12_4_ = fVar3;
  local_2640._16_4_ = fVar3;
  local_2640._20_4_ = fVar3;
  local_2640._24_4_ = fVar3;
  local_2640._28_4_ = fVar3;
  auVar137 = ZEXT3264(local_2640);
  uVar64 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_29b8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar65 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_29c0 = uVar64 ^ 0x20;
  uVar67 = local_29b8 ^ 0x20;
  iVar4 = (tray->tnear).field_0.i[k];
  local_2940._4_4_ = iVar4;
  local_2940._0_4_ = iVar4;
  local_2940._8_4_ = iVar4;
  local_2940._12_4_ = iVar4;
  local_2940._16_4_ = iVar4;
  local_2940._20_4_ = iVar4;
  local_2940._24_4_ = iVar4;
  local_2940._28_4_ = iVar4;
  auVar139 = ZEXT3264(local_2940);
  iVar4 = (tray->tfar).field_0.i[k];
  auVar72 = ZEXT3264(CONCAT428(iVar4,CONCAT424(iVar4,CONCAT420(iVar4,CONCAT416(iVar4,CONCAT412(iVar4
                                                  ,CONCAT48(iVar4,CONCAT44(iVar4,iVar4))))))));
  local_2500._16_16_ = mm_lookupmask_ps._240_16_;
  local_2500._0_16_ = mm_lookupmask_ps._0_16_;
  local_29d0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar88._8_4_ = 0x3f800000;
  auVar88._0_8_ = 0x3f8000003f800000;
  auVar88._12_4_ = 0x3f800000;
  auVar88._16_4_ = 0x3f800000;
  auVar88._20_4_ = 0x3f800000;
  auVar88._24_4_ = 0x3f800000;
  auVar88._28_4_ = 0x3f800000;
  auVar75._8_4_ = 0xbf800000;
  auVar75._0_8_ = 0xbf800000bf800000;
  auVar75._12_4_ = 0xbf800000;
  auVar75._16_4_ = 0xbf800000;
  auVar75._20_4_ = 0xbf800000;
  auVar75._24_4_ = 0xbf800000;
  auVar75._28_4_ = 0xbf800000;
  _local_2520 = vblendvps_avx(auVar88,auVar75,local_2500);
LAB_005e1570:
  do {
    pauVar66 = pauVar52 + -1;
    pauVar52 = pauVar52 + -1;
    if (*(float *)(*pauVar66 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar58 = *(ulong *)*pauVar52;
      while ((uVar58 & 8) == 0) {
        auVar106 = auVar108._0_32_;
        auVar75 = vsubps_avx(*(undefined1 (*) [32])(uVar58 + 0x40 + uVar64),auVar106);
        auVar81._4_4_ = auVar119._4_4_ * auVar75._4_4_;
        auVar81._0_4_ = auVar119._0_4_ * auVar75._0_4_;
        auVar81._8_4_ = auVar119._8_4_ * auVar75._8_4_;
        auVar81._12_4_ = auVar119._12_4_ * auVar75._12_4_;
        auVar81._16_4_ = auVar119._16_4_ * auVar75._16_4_;
        auVar81._20_4_ = auVar119._20_4_ * auVar75._20_4_;
        auVar81._24_4_ = auVar119._24_4_ * auVar75._24_4_;
        auVar81._28_4_ = auVar75._28_4_;
        auVar109 = auVar113._0_32_;
        auVar75 = vsubps_avx(*(undefined1 (*) [32])(uVar58 + 0x40 + local_29b8),auVar109);
        auVar28._4_4_ = auVar127._4_4_ * auVar75._4_4_;
        auVar28._0_4_ = auVar127._0_4_ * auVar75._0_4_;
        auVar28._8_4_ = auVar127._8_4_ * auVar75._8_4_;
        auVar28._12_4_ = auVar127._12_4_ * auVar75._12_4_;
        auVar28._16_4_ = auVar127._16_4_ * auVar75._16_4_;
        auVar28._20_4_ = auVar127._20_4_ * auVar75._20_4_;
        auVar28._24_4_ = auVar127._24_4_ * auVar75._24_4_;
        auVar28._28_4_ = auVar75._28_4_;
        auVar75 = vmaxps_avx(auVar81,auVar28);
        auVar81 = auVar114._0_32_;
        auVar88 = vsubps_avx(*(undefined1 (*) [32])(uVar58 + 0x40 + uVar65),auVar81);
        auVar29._4_4_ = auVar132._4_4_ * auVar88._4_4_;
        auVar29._0_4_ = auVar132._0_4_ * auVar88._0_4_;
        auVar29._8_4_ = auVar132._8_4_ * auVar88._8_4_;
        auVar29._12_4_ = auVar132._12_4_ * auVar88._12_4_;
        auVar29._16_4_ = auVar132._16_4_ * auVar88._16_4_;
        auVar29._20_4_ = auVar132._20_4_ * auVar88._20_4_;
        auVar29._24_4_ = auVar132._24_4_ * auVar88._24_4_;
        auVar29._28_4_ = auVar88._28_4_;
        auVar88 = vmaxps_avx(auVar29,auVar139._0_32_);
        local_2800 = vmaxps_avx(auVar75,auVar88);
        auVar75 = vsubps_avx(*(undefined1 (*) [32])(uVar58 + 0x40 + local_29c0),auVar106);
        auVar30._4_4_ = auVar133._4_4_ * auVar75._4_4_;
        auVar30._0_4_ = auVar133._0_4_ * auVar75._0_4_;
        auVar30._8_4_ = auVar133._8_4_ * auVar75._8_4_;
        auVar30._12_4_ = auVar133._12_4_ * auVar75._12_4_;
        auVar30._16_4_ = auVar133._16_4_ * auVar75._16_4_;
        auVar30._20_4_ = auVar133._20_4_ * auVar75._20_4_;
        auVar30._24_4_ = auVar133._24_4_ * auVar75._24_4_;
        auVar30._28_4_ = auVar75._28_4_;
        auVar75 = vsubps_avx(*(undefined1 (*) [32])(uVar58 + 0x40 + uVar67),auVar109);
        auVar31._4_4_ = auVar135._4_4_ * auVar75._4_4_;
        auVar31._0_4_ = auVar135._0_4_ * auVar75._0_4_;
        auVar31._8_4_ = auVar135._8_4_ * auVar75._8_4_;
        auVar31._12_4_ = auVar135._12_4_ * auVar75._12_4_;
        auVar31._16_4_ = auVar135._16_4_ * auVar75._16_4_;
        auVar31._20_4_ = auVar135._20_4_ * auVar75._20_4_;
        auVar31._24_4_ = auVar135._24_4_ * auVar75._24_4_;
        auVar31._28_4_ = auVar75._28_4_;
        auVar75 = vminps_avx(auVar30,auVar31);
        auVar88 = vsubps_avx(*(undefined1 (*) [32])(uVar58 + 0x40 + (uVar65 ^ 0x20)),auVar81);
        auVar32._4_4_ = auVar137._4_4_ * auVar88._4_4_;
        auVar32._0_4_ = auVar137._0_4_ * auVar88._0_4_;
        auVar32._8_4_ = auVar137._8_4_ * auVar88._8_4_;
        auVar32._12_4_ = auVar137._12_4_ * auVar88._12_4_;
        auVar32._16_4_ = auVar137._16_4_ * auVar88._16_4_;
        auVar32._20_4_ = auVar137._20_4_ * auVar88._20_4_;
        auVar32._24_4_ = auVar137._24_4_ * auVar88._24_4_;
        auVar32._28_4_ = auVar88._28_4_;
        auVar88 = vminps_avx(auVar32,auVar72._0_32_);
        auVar75 = vminps_avx(auVar75,auVar88);
        auVar75 = vcmpps_avx(local_2800,auVar75,2);
        uVar55 = vmovmskps_avx(auVar75);
        if (uVar55 == 0) {
          if (pauVar52 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_005e1570;
        }
        uVar55 = uVar55 & 0xff;
        uVar54 = uVar58 & 0xfffffffffffffff0;
        lVar61 = 0;
        for (uVar58 = (ulong)uVar55; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
          lVar61 = lVar61 + 1;
        }
        uVar58 = *(ulong *)(uVar54 + lVar61 * 8);
        uVar55 = uVar55 - 1 & uVar55;
        uVar56 = (ulong)uVar55;
        if (uVar55 != 0) {
          uVar51 = *(uint *)(local_2800 + lVar61 * 4);
          lVar61 = 0;
          for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
            lVar61 = lVar61 + 1;
          }
          uVar55 = uVar55 - 1 & uVar55;
          uVar62 = (ulong)uVar55;
          uVar56 = *(ulong *)(uVar54 + lVar61 * 8);
          uVar6 = *(uint *)(local_2800 + lVar61 * 4);
          if (uVar55 == 0) {
            if (uVar51 < uVar6) {
              *(ulong *)*pauVar52 = uVar56;
              *(uint *)(*pauVar52 + 8) = uVar6;
              pauVar52 = pauVar52 + 1;
            }
            else {
              *(ulong *)*pauVar52 = uVar58;
              *(uint *)(*pauVar52 + 8) = uVar51;
              pauVar52 = pauVar52 + 1;
              uVar58 = uVar56;
            }
          }
          else {
            auVar73._8_8_ = 0;
            auVar73._0_8_ = uVar58;
            auVar73 = vpunpcklqdq_avx(auVar73,ZEXT416(uVar51));
            auVar83._8_8_ = 0;
            auVar83._0_8_ = uVar56;
            auVar83 = vpunpcklqdq_avx(auVar83,ZEXT416(uVar6));
            lVar61 = 0;
            for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
              lVar61 = lVar61 + 1;
            }
            uVar55 = uVar55 - 1 & uVar55;
            uVar58 = (ulong)uVar55;
            auVar86._8_8_ = 0;
            auVar86._0_8_ = *(ulong *)(uVar54 + lVar61 * 8);
            auVar74 = vpunpcklqdq_avx(auVar86,ZEXT416(*(uint *)(local_2800 + lVar61 * 4)));
            auVar86 = vpcmpgtd_avx(auVar83,auVar73);
            if (uVar55 == 0) {
              auVar97 = vpshufd_avx(auVar86,0xaa);
              auVar86 = vblendvps_avx(auVar83,auVar73,auVar97);
              auVar73 = vblendvps_avx(auVar73,auVar83,auVar97);
              auVar83 = vpcmpgtd_avx(auVar74,auVar86);
              auVar97 = vpshufd_avx(auVar83,0xaa);
              auVar83 = vblendvps_avx(auVar74,auVar86,auVar97);
              auVar86 = vblendvps_avx(auVar86,auVar74,auVar97);
              auVar74 = vpcmpgtd_avx(auVar86,auVar73);
              auVar97 = vpshufd_avx(auVar74,0xaa);
              auVar74 = vblendvps_avx(auVar86,auVar73,auVar97);
              auVar73 = vblendvps_avx(auVar73,auVar86,auVar97);
              *pauVar52 = auVar73;
              pauVar52[1] = auVar74;
              uVar58 = auVar83._0_8_;
              pauVar52 = pauVar52 + 2;
            }
            else {
              lVar61 = 0;
              for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
                lVar61 = lVar61 + 1;
              }
              uVar55 = uVar55 - 1 & uVar55;
              uVar56 = (ulong)uVar55;
              auVar97._8_8_ = 0;
              auVar97._0_8_ = *(ulong *)(uVar54 + lVar61 * 8);
              auVar97 = vpunpcklqdq_avx(auVar97,ZEXT416(*(uint *)(local_2800 + lVar61 * 4)));
              if (uVar55 == 0) {
                auVar87 = vpshufd_avx(auVar86,0xaa);
                auVar86 = vblendvps_avx(auVar83,auVar73,auVar87);
                auVar73 = vblendvps_avx(auVar73,auVar83,auVar87);
                auVar83 = vpcmpgtd_avx(auVar97,auVar74);
                auVar87 = vpshufd_avx(auVar83,0xaa);
                auVar83 = vblendvps_avx(auVar97,auVar74,auVar87);
                auVar74 = vblendvps_avx(auVar74,auVar97,auVar87);
                auVar97 = vpcmpgtd_avx(auVar74,auVar73);
                auVar87 = vpshufd_avx(auVar97,0xaa);
                auVar97 = vblendvps_avx(auVar74,auVar73,auVar87);
                auVar73 = vblendvps_avx(auVar73,auVar74,auVar87);
                auVar74 = vpcmpgtd_avx(auVar83,auVar86);
                auVar87 = vpshufd_avx(auVar74,0xaa);
                auVar74 = vblendvps_avx(auVar83,auVar86,auVar87);
                auVar83 = vblendvps_avx(auVar86,auVar83,auVar87);
                auVar86 = vpcmpgtd_avx(auVar97,auVar83);
                auVar87 = vpshufd_avx(auVar86,0xaa);
                auVar86 = vblendvps_avx(auVar97,auVar83,auVar87);
                auVar83 = vblendvps_avx(auVar83,auVar97,auVar87);
                *pauVar52 = auVar73;
                pauVar52[1] = auVar83;
                pauVar52[2] = auVar86;
                uVar58 = auVar74._0_8_;
                pauVar66 = pauVar52 + 3;
              }
              else {
                *pauVar52 = auVar73;
                pauVar52[1] = auVar83;
                pauVar52[2] = auVar74;
                pauVar52[3] = auVar97;
                lVar61 = 0x30;
                do {
                  lVar59 = lVar61;
                  lVar61 = 0;
                  for (uVar58 = uVar56; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000
                      ) {
                    lVar61 = lVar61 + 1;
                  }
                  uVar58 = *(ulong *)(uVar54 + lVar61 * 8);
                  auVar74._8_8_ = 0;
                  auVar74._0_8_ = uVar58;
                  auVar73 = vpunpcklqdq_avx(auVar74,ZEXT416(*(uint *)(local_2800 + lVar61 * 4)));
                  *(undefined1 (*) [16])(pauVar52[1] + lVar59) = auVar73;
                  uVar56 = uVar56 - 1 & uVar56;
                  lVar61 = lVar59 + 0x10;
                } while (uVar56 != 0);
                pauVar66 = (undefined1 (*) [16])(pauVar52[1] + lVar59);
                if (lVar59 + 0x10 != 0) {
                  lVar61 = 0x10;
                  pauVar57 = pauVar52;
                  do {
                    auVar73 = pauVar57[1];
                    pauVar57 = pauVar57 + 1;
                    uVar55 = vextractps_avx(auVar73,2);
                    lVar59 = lVar61;
                    do {
                      if (uVar55 <= *(uint *)(pauVar52[-1] + lVar59 + 8)) {
                        pauVar60 = (undefined1 (*) [16])(*pauVar52 + lVar59);
                        break;
                      }
                      *(undefined1 (*) [16])(*pauVar52 + lVar59) =
                           *(undefined1 (*) [16])(pauVar52[-1] + lVar59);
                      lVar59 = lVar59 + -0x10;
                      pauVar60 = pauVar52;
                    } while (lVar59 != 0);
                    *pauVar60 = auVar73;
                    lVar61 = lVar61 + 0x10;
                  } while (pauVar66 != pauVar57);
                  uVar58 = *(ulong *)*pauVar66;
                }
              }
              auVar108 = ZEXT3264(auVar106);
              auVar113 = ZEXT3264(auVar109);
              auVar114 = ZEXT3264(auVar81);
              auVar119 = ZEXT3264(auVar119._0_32_);
              auVar127 = ZEXT3264(auVar127._0_32_);
              auVar132 = ZEXT3264(auVar132._0_32_);
              auVar133 = ZEXT3264(auVar133._0_32_);
              auVar135 = ZEXT3264(auVar135._0_32_);
              auVar137 = ZEXT3264(auVar137._0_32_);
              auVar139 = ZEXT3264(local_2940);
              pauVar52 = pauVar66;
            }
          }
        }
      }
      local_29c8 = (ulong)((uint)uVar58 & 0xf) - 8;
      if (local_29c8 != 0) {
        uVar58 = uVar58 & 0xfffffffffffffff0;
        lVar61 = 0;
        do {
          lVar53 = lVar61 * 0xe0;
          lVar59 = uVar58 + 0xd0 + lVar53;
          local_28c0 = *(undefined8 *)(lVar59 + 0x10);
          uStack_28b8 = *(undefined8 *)(lVar59 + 0x18);
          lVar59 = uVar58 + 0xc0 + lVar53;
          local_23c0 = *(undefined8 *)(lVar59 + 0x10);
          uStack_23b8 = *(undefined8 *)(lVar59 + 0x18);
          uStack_23b0 = local_23c0;
          uStack_23a8 = uStack_23b8;
          uStack_28b0 = local_28c0;
          uStack_28a8 = uStack_28b8;
          auVar89._16_16_ = *(undefined1 (*) [16])(uVar58 + 0x60 + lVar53);
          auVar89._0_16_ = *(undefined1 (*) [16])(uVar58 + lVar53);
          auVar76._16_16_ = *(undefined1 (*) [16])(uVar58 + 0x70 + lVar53);
          auVar76._0_16_ = *(undefined1 (*) [16])(uVar58 + 0x10 + lVar53);
          auVar84._16_16_ = *(undefined1 (*) [16])(uVar58 + 0x80 + lVar53);
          auVar84._0_16_ = *(undefined1 (*) [16])(uVar58 + 0x20 + lVar53);
          auVar73 = *(undefined1 (*) [16])(uVar58 + 0x30 + lVar53);
          auVar107._16_16_ = auVar73;
          auVar107._0_16_ = auVar73;
          auVar73 = *(undefined1 (*) [16])(uVar58 + 0x40 + lVar53);
          auVar92._16_16_ = auVar73;
          auVar92._0_16_ = auVar73;
          auVar73 = *(undefined1 (*) [16])(uVar58 + 0x50 + lVar53);
          auVar98._16_16_ = auVar73;
          auVar98._0_16_ = auVar73;
          auVar73 = *(undefined1 (*) [16])(uVar58 + 0x90 + lVar53);
          auVar110._16_16_ = auVar73;
          auVar110._0_16_ = auVar73;
          auVar73 = *(undefined1 (*) [16])(uVar58 + 0xa0 + lVar53);
          auVar138._16_16_ = auVar73;
          auVar138._0_16_ = auVar73;
          auVar73 = *(undefined1 (*) [16])(uVar58 + 0xb0 + lVar53);
          auVar69._16_16_ = auVar73;
          auVar69._0_16_ = auVar73;
          uVar128 = *(undefined4 *)(ray + k * 4);
          auVar129._4_4_ = uVar128;
          auVar129._0_4_ = uVar128;
          auVar129._8_4_ = uVar128;
          auVar129._12_4_ = uVar128;
          auVar129._16_4_ = uVar128;
          auVar129._20_4_ = uVar128;
          auVar129._24_4_ = uVar128;
          auVar129._28_4_ = uVar128;
          uVar128 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar134._4_4_ = uVar128;
          auVar134._0_4_ = uVar128;
          auVar134._8_4_ = uVar128;
          auVar134._12_4_ = uVar128;
          auVar134._16_4_ = uVar128;
          auVar134._20_4_ = uVar128;
          auVar134._24_4_ = uVar128;
          auVar134._28_4_ = uVar128;
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar136._4_4_ = uVar5;
          auVar136._0_4_ = uVar5;
          auVar136._8_4_ = uVar5;
          auVar136._12_4_ = uVar5;
          auVar136._16_4_ = uVar5;
          auVar136._20_4_ = uVar5;
          auVar136._24_4_ = uVar5;
          auVar136._28_4_ = uVar5;
          local_2980 = vsubps_avx(auVar89,auVar129);
          auVar28 = vsubps_avx(auVar76,auVar134);
          auVar75 = vsubps_avx(auVar84,auVar136);
          auVar88 = vsubps_avx(auVar107,auVar129);
          auVar81 = vsubps_avx(auVar92,auVar134);
          auVar29 = vsubps_avx(auVar98,auVar136);
          auVar30 = vsubps_avx(auVar110,auVar129);
          auVar31 = vsubps_avx(auVar138,auVar134);
          auVar32 = vsubps_avx(auVar69,auVar136);
          local_2920 = vsubps_avx(auVar30,local_2980);
          local_2400 = vsubps_avx(auVar31,auVar28);
          local_23e0 = vsubps_avx(auVar32,auVar75);
          auVar70._0_4_ = local_2980._0_4_ + auVar30._0_4_;
          auVar70._4_4_ = local_2980._4_4_ + auVar30._4_4_;
          auVar70._8_4_ = local_2980._8_4_ + auVar30._8_4_;
          auVar70._12_4_ = local_2980._12_4_ + auVar30._12_4_;
          auVar70._16_4_ = local_2980._16_4_ + auVar30._16_4_;
          auVar70._20_4_ = local_2980._20_4_ + auVar30._20_4_;
          auVar70._24_4_ = local_2980._24_4_ + auVar30._24_4_;
          auVar70._28_4_ = local_2980._28_4_ + auVar30._28_4_;
          auVar111._0_4_ = auVar31._0_4_ + auVar28._0_4_;
          auVar111._4_4_ = auVar31._4_4_ + auVar28._4_4_;
          auVar111._8_4_ = auVar31._8_4_ + auVar28._8_4_;
          auVar111._12_4_ = auVar31._12_4_ + auVar28._12_4_;
          auVar111._16_4_ = auVar31._16_4_ + auVar28._16_4_;
          auVar111._20_4_ = auVar31._20_4_ + auVar28._20_4_;
          auVar111._24_4_ = auVar31._24_4_ + auVar28._24_4_;
          auVar111._28_4_ = auVar31._28_4_ + auVar28._28_4_;
          fVar1 = auVar75._0_4_;
          auVar93._0_4_ = auVar32._0_4_ + fVar1;
          fVar2 = auVar75._4_4_;
          auVar93._4_4_ = auVar32._4_4_ + fVar2;
          fVar3 = auVar75._8_4_;
          auVar93._8_4_ = auVar32._8_4_ + fVar3;
          fVar27 = auVar75._12_4_;
          auVar93._12_4_ = auVar32._12_4_ + fVar27;
          fVar9 = auVar75._16_4_;
          auVar93._16_4_ = auVar32._16_4_ + fVar9;
          fVar10 = auVar75._20_4_;
          auVar93._20_4_ = auVar32._20_4_ + fVar10;
          fVar11 = auVar75._24_4_;
          auVar93._24_4_ = auVar32._24_4_ + fVar11;
          fVar120 = auVar32._28_4_;
          auVar93._28_4_ = fVar120 + auVar75._28_4_;
          auVar106._4_4_ = local_23e0._4_4_ * auVar111._4_4_;
          auVar106._0_4_ = local_23e0._0_4_ * auVar111._0_4_;
          auVar106._8_4_ = local_23e0._8_4_ * auVar111._8_4_;
          auVar106._12_4_ = local_23e0._12_4_ * auVar111._12_4_;
          auVar106._16_4_ = local_23e0._16_4_ * auVar111._16_4_;
          auVar106._20_4_ = local_23e0._20_4_ * auVar111._20_4_;
          auVar106._24_4_ = local_23e0._24_4_ * auVar111._24_4_;
          auVar106._28_4_ = uVar128;
          auVar83 = vfmsub231ps_fma(auVar106,local_2400,auVar93);
          auVar109._4_4_ = local_2920._4_4_ * auVar93._4_4_;
          auVar109._0_4_ = local_2920._0_4_ * auVar93._0_4_;
          auVar109._8_4_ = local_2920._8_4_ * auVar93._8_4_;
          auVar109._12_4_ = local_2920._12_4_ * auVar93._12_4_;
          auVar109._16_4_ = local_2920._16_4_ * auVar93._16_4_;
          auVar109._20_4_ = local_2920._20_4_ * auVar93._20_4_;
          auVar109._24_4_ = local_2920._24_4_ * auVar93._24_4_;
          auVar109._28_4_ = auVar93._28_4_;
          auVar73 = vfmsub231ps_fma(auVar109,local_23e0,auVar70);
          auVar33._4_4_ = local_2400._4_4_ * auVar70._4_4_;
          auVar33._0_4_ = local_2400._0_4_ * auVar70._0_4_;
          auVar33._8_4_ = local_2400._8_4_ * auVar70._8_4_;
          auVar33._12_4_ = local_2400._12_4_ * auVar70._12_4_;
          auVar33._16_4_ = local_2400._16_4_ * auVar70._16_4_;
          auVar33._20_4_ = local_2400._20_4_ * auVar70._20_4_;
          auVar33._24_4_ = local_2400._24_4_ * auVar70._24_4_;
          auVar33._28_4_ = auVar70._28_4_;
          auVar86 = vfmsub231ps_fma(auVar33,local_2920,auVar111);
          uVar128 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar130._4_4_ = uVar128;
          auVar130._0_4_ = uVar128;
          auVar130._8_4_ = uVar128;
          auVar130._12_4_ = uVar128;
          auVar130._16_4_ = uVar128;
          auVar130._20_4_ = uVar128;
          auVar130._24_4_ = uVar128;
          auVar130._28_4_ = uVar128;
          local_2440 = *(float *)(ray + k * 4 + 0x60);
          auVar34._4_4_ = local_2440 * auVar86._4_4_;
          auVar34._0_4_ = local_2440 * auVar86._0_4_;
          auVar34._8_4_ = local_2440 * auVar86._8_4_;
          auVar34._12_4_ = local_2440 * auVar86._12_4_;
          auVar34._16_4_ = local_2440 * 0.0;
          auVar34._20_4_ = local_2440 * 0.0;
          auVar34._24_4_ = local_2440 * 0.0;
          auVar34._28_4_ = fVar120;
          auVar73 = vfmadd231ps_fma(auVar34,auVar130,ZEXT1632(auVar73));
          uVar128 = *(undefined4 *)(ray + k * 4 + 0x40);
          local_2420._4_4_ = uVar128;
          local_2420._0_4_ = uVar128;
          local_2420._8_4_ = uVar128;
          local_2420._12_4_ = uVar128;
          local_2420._16_4_ = uVar128;
          local_2420._20_4_ = uVar128;
          local_2420._24_4_ = uVar128;
          local_2420._28_4_ = uVar128;
          auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),local_2420,ZEXT1632(auVar83));
          local_2460 = vsubps_avx(auVar28,auVar81);
          local_2480 = vsubps_avx(auVar75,auVar29);
          auVar77._0_4_ = auVar81._0_4_ + auVar28._0_4_;
          auVar77._4_4_ = auVar81._4_4_ + auVar28._4_4_;
          auVar77._8_4_ = auVar81._8_4_ + auVar28._8_4_;
          auVar77._12_4_ = auVar81._12_4_ + auVar28._12_4_;
          auVar77._16_4_ = auVar81._16_4_ + auVar28._16_4_;
          auVar77._20_4_ = auVar81._20_4_ + auVar28._20_4_;
          auVar77._24_4_ = auVar81._24_4_ + auVar28._24_4_;
          auVar77._28_4_ = auVar81._28_4_ + auVar28._28_4_;
          auVar94._0_4_ = fVar1 + auVar29._0_4_;
          auVar94._4_4_ = fVar2 + auVar29._4_4_;
          auVar94._8_4_ = fVar3 + auVar29._8_4_;
          auVar94._12_4_ = fVar27 + auVar29._12_4_;
          auVar94._16_4_ = fVar9 + auVar29._16_4_;
          auVar94._20_4_ = fVar10 + auVar29._20_4_;
          auVar94._24_4_ = fVar11 + auVar29._24_4_;
          fVar115 = auVar29._28_4_;
          auVar94._28_4_ = auVar75._28_4_ + fVar115;
          fVar100 = local_2480._0_4_;
          fVar103 = local_2480._4_4_;
          auVar35._4_4_ = auVar77._4_4_ * fVar103;
          auVar35._0_4_ = auVar77._0_4_ * fVar100;
          fVar12 = local_2480._8_4_;
          auVar35._8_4_ = auVar77._8_4_ * fVar12;
          fVar15 = local_2480._12_4_;
          auVar35._12_4_ = auVar77._12_4_ * fVar15;
          fVar18 = local_2480._16_4_;
          auVar35._16_4_ = auVar77._16_4_ * fVar18;
          fVar21 = local_2480._20_4_;
          auVar35._20_4_ = auVar77._20_4_ * fVar21;
          fVar24 = local_2480._24_4_;
          auVar35._24_4_ = auVar77._24_4_ * fVar24;
          auVar35._28_4_ = auVar111._28_4_;
          auVar86 = vfmsub231ps_fma(auVar35,local_2460,auVar94);
          local_24a0 = vsubps_avx(local_2980,auVar88);
          fVar101 = local_24a0._0_4_;
          fVar104 = local_24a0._4_4_;
          auVar36._4_4_ = auVar94._4_4_ * fVar104;
          auVar36._0_4_ = auVar94._0_4_ * fVar101;
          fVar13 = local_24a0._8_4_;
          auVar36._8_4_ = auVar94._8_4_ * fVar13;
          fVar16 = local_24a0._12_4_;
          auVar36._12_4_ = auVar94._12_4_ * fVar16;
          fVar19 = local_24a0._16_4_;
          auVar36._16_4_ = auVar94._16_4_ * fVar19;
          fVar22 = local_24a0._20_4_;
          auVar36._20_4_ = auVar94._20_4_ * fVar22;
          fVar25 = local_24a0._24_4_;
          auVar36._24_4_ = auVar94._24_4_ * fVar25;
          auVar36._28_4_ = auVar94._28_4_;
          auVar116._0_4_ = local_2980._0_4_ + auVar88._0_4_;
          auVar116._4_4_ = local_2980._4_4_ + auVar88._4_4_;
          auVar116._8_4_ = local_2980._8_4_ + auVar88._8_4_;
          auVar116._12_4_ = local_2980._12_4_ + auVar88._12_4_;
          auVar116._16_4_ = local_2980._16_4_ + auVar88._16_4_;
          auVar116._20_4_ = local_2980._20_4_ + auVar88._20_4_;
          auVar116._24_4_ = local_2980._24_4_ + auVar88._24_4_;
          auVar116._28_4_ = local_2980._28_4_ + auVar88._28_4_;
          auVar83 = vfmsub231ps_fma(auVar36,local_2480,auVar116);
          fVar102 = local_2460._0_4_;
          fVar105 = local_2460._4_4_;
          auVar37._4_4_ = auVar116._4_4_ * fVar105;
          auVar37._0_4_ = auVar116._0_4_ * fVar102;
          fVar14 = local_2460._8_4_;
          auVar37._8_4_ = auVar116._8_4_ * fVar14;
          fVar17 = local_2460._12_4_;
          auVar37._12_4_ = auVar116._12_4_ * fVar17;
          fVar20 = local_2460._16_4_;
          auVar37._16_4_ = auVar116._16_4_ * fVar20;
          fVar23 = local_2460._20_4_;
          auVar37._20_4_ = auVar116._20_4_ * fVar23;
          fVar26 = local_2460._24_4_;
          auVar37._24_4_ = auVar116._24_4_ * fVar26;
          auVar37._28_4_ = auVar116._28_4_;
          auVar74 = vfmsub231ps_fma(auVar37,local_24a0,auVar77);
          auVar117._0_4_ = auVar74._0_4_ * local_2440;
          auVar117._4_4_ = auVar74._4_4_ * local_2440;
          auVar117._8_4_ = auVar74._8_4_ * local_2440;
          auVar117._12_4_ = auVar74._12_4_ * local_2440;
          auVar117._16_4_ = local_2440 * 0.0;
          auVar117._20_4_ = local_2440 * 0.0;
          auVar117._24_4_ = local_2440 * 0.0;
          auVar117._28_4_ = 0;
          auVar83 = vfmadd231ps_fma(auVar117,auVar130,ZEXT1632(auVar83));
          auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),local_2420,ZEXT1632(auVar86));
          auVar106 = vsubps_avx(auVar88,auVar30);
          auVar90._0_4_ = auVar88._0_4_ + auVar30._0_4_;
          auVar90._4_4_ = auVar88._4_4_ + auVar30._4_4_;
          auVar90._8_4_ = auVar88._8_4_ + auVar30._8_4_;
          auVar90._12_4_ = auVar88._12_4_ + auVar30._12_4_;
          auVar90._16_4_ = auVar88._16_4_ + auVar30._16_4_;
          auVar90._20_4_ = auVar88._20_4_ + auVar30._20_4_;
          auVar90._24_4_ = auVar88._24_4_ + auVar30._24_4_;
          auVar90._28_4_ = auVar88._28_4_ + auVar30._28_4_;
          auVar30 = vsubps_avx(auVar81,auVar31);
          auVar99._0_4_ = auVar81._0_4_ + auVar31._0_4_;
          auVar99._4_4_ = auVar81._4_4_ + auVar31._4_4_;
          auVar99._8_4_ = auVar81._8_4_ + auVar31._8_4_;
          auVar99._12_4_ = auVar81._12_4_ + auVar31._12_4_;
          auVar99._16_4_ = auVar81._16_4_ + auVar31._16_4_;
          auVar99._20_4_ = auVar81._20_4_ + auVar31._20_4_;
          auVar99._24_4_ = auVar81._24_4_ + auVar31._24_4_;
          auVar99._28_4_ = auVar81._28_4_ + auVar31._28_4_;
          auVar31 = vsubps_avx(auVar29,auVar32);
          auVar78._0_4_ = auVar29._0_4_ + auVar32._0_4_;
          auVar78._4_4_ = auVar29._4_4_ + auVar32._4_4_;
          auVar78._8_4_ = auVar29._8_4_ + auVar32._8_4_;
          auVar78._12_4_ = auVar29._12_4_ + auVar32._12_4_;
          auVar78._16_4_ = auVar29._16_4_ + auVar32._16_4_;
          auVar78._20_4_ = auVar29._20_4_ + auVar32._20_4_;
          auVar78._24_4_ = auVar29._24_4_ + auVar32._24_4_;
          auVar78._28_4_ = fVar115 + fVar120;
          auVar38._4_4_ = auVar31._4_4_ * auVar99._4_4_;
          auVar38._0_4_ = auVar31._0_4_ * auVar99._0_4_;
          auVar38._8_4_ = auVar31._8_4_ * auVar99._8_4_;
          auVar38._12_4_ = auVar31._12_4_ * auVar99._12_4_;
          auVar38._16_4_ = auVar31._16_4_ * auVar99._16_4_;
          auVar38._20_4_ = auVar31._20_4_ * auVar99._20_4_;
          auVar38._24_4_ = auVar31._24_4_ * auVar99._24_4_;
          auVar38._28_4_ = fVar115;
          auVar74 = vfmsub231ps_fma(auVar38,auVar30,auVar78);
          auVar39._4_4_ = auVar78._4_4_ * auVar106._4_4_;
          auVar39._0_4_ = auVar78._0_4_ * auVar106._0_4_;
          auVar39._8_4_ = auVar78._8_4_ * auVar106._8_4_;
          auVar39._12_4_ = auVar78._12_4_ * auVar106._12_4_;
          auVar39._16_4_ = auVar78._16_4_ * auVar106._16_4_;
          auVar39._20_4_ = auVar78._20_4_ * auVar106._20_4_;
          auVar39._24_4_ = auVar78._24_4_ * auVar106._24_4_;
          auVar39._28_4_ = auVar78._28_4_;
          auVar86 = vfmsub231ps_fma(auVar39,auVar31,auVar90);
          auVar40._4_4_ = auVar30._4_4_ * auVar90._4_4_;
          auVar40._0_4_ = auVar30._0_4_ * auVar90._0_4_;
          auVar40._8_4_ = auVar30._8_4_ * auVar90._8_4_;
          auVar40._12_4_ = auVar30._12_4_ * auVar90._12_4_;
          auVar40._16_4_ = auVar30._16_4_ * auVar90._16_4_;
          auVar40._20_4_ = auVar30._20_4_ * auVar90._20_4_;
          auVar40._24_4_ = auVar30._24_4_ * auVar90._24_4_;
          auVar40._28_4_ = auVar90._28_4_;
          auVar97 = vfmsub231ps_fma(auVar40,auVar106,auVar99);
          fStack_243c = local_2440;
          fStack_2438 = local_2440;
          fStack_2434 = local_2440;
          fStack_2430 = local_2440;
          fStack_242c = local_2440;
          fStack_2428 = local_2440;
          fStack_2424 = local_2440;
          auVar91._0_4_ = local_2440 * auVar97._0_4_;
          auVar91._4_4_ = local_2440 * auVar97._4_4_;
          auVar91._8_4_ = local_2440 * auVar97._8_4_;
          auVar91._12_4_ = local_2440 * auVar97._12_4_;
          auVar91._16_4_ = local_2440 * 0.0;
          auVar91._20_4_ = local_2440 * 0.0;
          auVar91._24_4_ = local_2440 * 0.0;
          auVar91._28_4_ = 0;
          auVar86 = vfmadd231ps_fma(auVar91,auVar130,ZEXT1632(auVar86));
          auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),local_2420,ZEXT1632(auVar74));
          local_27e0 = ZEXT1632(auVar83);
          local_27c0 = ZEXT1632(CONCAT412(auVar86._12_4_ + auVar83._12_4_ + auVar73._12_4_,
                                          CONCAT48(auVar86._8_4_ + auVar83._8_4_ + auVar73._8_4_,
                                                   CONCAT44(auVar86._4_4_ +
                                                            auVar83._4_4_ + auVar73._4_4_,
                                                            auVar86._0_4_ +
                                                            auVar83._0_4_ + auVar73._0_4_))));
          auVar79._8_4_ = 0x7fffffff;
          auVar79._0_8_ = 0x7fffffff7fffffff;
          auVar79._12_4_ = 0x7fffffff;
          auVar79._16_4_ = 0x7fffffff;
          auVar79._20_4_ = 0x7fffffff;
          auVar79._24_4_ = 0x7fffffff;
          auVar79._28_4_ = 0x7fffffff;
          auVar75 = vminps_avx(ZEXT1632(auVar73),local_27e0);
          auVar75 = vminps_avx(auVar75,ZEXT1632(auVar86));
          local_24e0 = vandps_avx(local_27c0,auVar79);
          fVar115 = local_24e0._0_4_ * 1.1920929e-07;
          fVar120 = local_24e0._4_4_ * 1.1920929e-07;
          auVar41._4_4_ = fVar120;
          auVar41._0_4_ = fVar115;
          fVar121 = local_24e0._8_4_ * 1.1920929e-07;
          auVar41._8_4_ = fVar121;
          fVar122 = local_24e0._12_4_ * 1.1920929e-07;
          auVar41._12_4_ = fVar122;
          fVar123 = local_24e0._16_4_ * 1.1920929e-07;
          auVar41._16_4_ = fVar123;
          fVar124 = local_24e0._20_4_ * 1.1920929e-07;
          auVar41._20_4_ = fVar124;
          fVar125 = local_24e0._24_4_ * 1.1920929e-07;
          auVar41._24_4_ = fVar125;
          auVar41._28_4_ = 0x34000000;
          auVar112._0_8_ = CONCAT44(fVar120,fVar115) ^ 0x8000000080000000;
          auVar112._8_4_ = -fVar121;
          auVar112._12_4_ = -fVar122;
          auVar112._16_4_ = -fVar123;
          auVar112._20_4_ = -fVar124;
          auVar112._24_4_ = -fVar125;
          auVar112._28_4_ = 0xb4000000;
          auVar75 = vcmpps_avx(auVar75,auVar112,5);
          local_24c0 = ZEXT1632(auVar73);
          auVar81 = vmaxps_avx(ZEXT1632(auVar73),local_27e0);
          auVar88 = vmaxps_avx(auVar81,ZEXT1632(auVar86));
          auVar88 = vcmpps_avx(auVar88,auVar41,2);
          auVar88 = vorps_avx(auVar75,auVar88);
          if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar88 >> 0x7f,0) != '\0') ||
                (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar88 >> 0xbf,0) != '\0') ||
              (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar88[0x1f] < '\0') {
            auVar42._4_4_ = fVar105 * local_23e0._4_4_;
            auVar42._0_4_ = fVar102 * local_23e0._0_4_;
            auVar42._8_4_ = fVar14 * local_23e0._8_4_;
            auVar42._12_4_ = fVar17 * local_23e0._12_4_;
            auVar42._16_4_ = fVar20 * local_23e0._16_4_;
            auVar42._20_4_ = fVar23 * local_23e0._20_4_;
            auVar42._24_4_ = fVar26 * local_23e0._24_4_;
            auVar42._28_4_ = auVar75._28_4_;
            auVar43._4_4_ = fVar104 * local_2400._4_4_;
            auVar43._0_4_ = fVar101 * local_2400._0_4_;
            auVar43._8_4_ = fVar13 * local_2400._8_4_;
            auVar43._12_4_ = fVar16 * local_2400._12_4_;
            auVar43._16_4_ = fVar19 * local_2400._16_4_;
            auVar43._20_4_ = fVar22 * local_2400._20_4_;
            auVar43._24_4_ = fVar25 * local_2400._24_4_;
            auVar43._28_4_ = 0x34000000;
            auVar86 = vfmsub213ps_fma(local_2400,local_2480,auVar42);
            auVar44._4_4_ = auVar30._4_4_ * fVar103;
            auVar44._0_4_ = auVar30._0_4_ * fVar100;
            auVar44._8_4_ = auVar30._8_4_ * fVar12;
            auVar44._12_4_ = auVar30._12_4_ * fVar15;
            auVar44._16_4_ = auVar30._16_4_ * fVar18;
            auVar44._20_4_ = auVar30._20_4_ * fVar21;
            auVar44._24_4_ = auVar30._24_4_ * fVar24;
            auVar44._28_4_ = auVar81._28_4_;
            auVar45._4_4_ = fVar104 * auVar31._4_4_;
            auVar45._0_4_ = fVar101 * auVar31._0_4_;
            auVar45._8_4_ = fVar13 * auVar31._8_4_;
            auVar45._12_4_ = fVar16 * auVar31._12_4_;
            auVar45._16_4_ = fVar19 * auVar31._16_4_;
            auVar45._20_4_ = fVar22 * auVar31._20_4_;
            auVar45._24_4_ = fVar25 * auVar31._24_4_;
            auVar45._28_4_ = local_24e0._28_4_;
            auVar74 = vfmsub213ps_fma(auVar31,local_2460,auVar44);
            auVar75 = vandps_avx(auVar42,auVar79);
            auVar81 = vandps_avx(auVar44,auVar79);
            auVar75 = vcmpps_avx(auVar75,auVar81,1);
            local_27a0 = vblendvps_avx(ZEXT1632(auVar74),ZEXT1632(auVar86),auVar75);
            auVar46._4_4_ = fVar105 * auVar106._4_4_;
            auVar46._0_4_ = fVar102 * auVar106._0_4_;
            auVar46._8_4_ = fVar14 * auVar106._8_4_;
            auVar46._12_4_ = fVar17 * auVar106._12_4_;
            auVar46._16_4_ = fVar20 * auVar106._16_4_;
            auVar46._20_4_ = fVar23 * auVar106._20_4_;
            auVar46._24_4_ = fVar26 * auVar106._24_4_;
            auVar46._28_4_ = auVar75._28_4_;
            auVar86 = vfmsub213ps_fma(auVar106,local_2480,auVar45);
            auVar47._4_4_ = local_2920._4_4_ * fVar103;
            auVar47._0_4_ = local_2920._0_4_ * fVar100;
            auVar47._8_4_ = local_2920._8_4_ * fVar12;
            auVar47._12_4_ = local_2920._12_4_ * fVar15;
            auVar47._16_4_ = local_2920._16_4_ * fVar18;
            auVar47._20_4_ = local_2920._20_4_ * fVar21;
            auVar47._24_4_ = local_2920._24_4_ * fVar24;
            auVar47._28_4_ = auVar81._28_4_;
            auVar74 = vfmsub213ps_fma(local_23e0,local_24a0,auVar47);
            auVar75 = vandps_avx(auVar47,auVar79);
            auVar81 = vandps_avx(auVar45,auVar79);
            auVar75 = vcmpps_avx(auVar75,auVar81,1);
            local_2780 = vblendvps_avx(ZEXT1632(auVar86),ZEXT1632(auVar74),auVar75);
            auVar86 = vfmsub213ps_fma(local_2920,local_2460,auVar43);
            auVar74 = vfmsub213ps_fma(auVar30,local_24a0,auVar46);
            auVar75 = vandps_avx(auVar43,auVar79);
            auVar81 = vandps_avx(auVar46,auVar79);
            auVar81 = vcmpps_avx(auVar75,auVar81,1);
            local_2760 = vblendvps_avx(ZEXT1632(auVar74),ZEXT1632(auVar86),auVar81);
            auVar86 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
            fVar115 = local_2760._0_4_;
            auVar80._0_4_ = fVar115 * local_2440;
            fVar100 = local_2760._4_4_;
            auVar80._4_4_ = fVar100 * local_2440;
            fVar101 = local_2760._8_4_;
            auVar80._8_4_ = fVar101 * local_2440;
            fVar102 = local_2760._12_4_;
            auVar80._12_4_ = fVar102 * local_2440;
            fVar103 = local_2760._16_4_;
            auVar80._16_4_ = fVar103 * local_2440;
            fVar104 = local_2760._20_4_;
            auVar80._20_4_ = fVar104 * local_2440;
            fVar105 = local_2760._24_4_;
            auVar80._24_4_ = fVar105 * local_2440;
            auVar80._28_4_ = 0;
            auVar74 = vfmadd213ps_fma(auVar130,local_2780,auVar80);
            auVar74 = vfmadd213ps_fma(local_2420,local_27a0,ZEXT1632(auVar74));
            auVar81 = ZEXT1632(CONCAT412(auVar74._12_4_ + auVar74._12_4_,
                                         CONCAT48(auVar74._8_4_ + auVar74._8_4_,
                                                  CONCAT44(auVar74._4_4_ + auVar74._4_4_,
                                                           auVar74._0_4_ + auVar74._0_4_))));
            auVar48._4_4_ = fVar100 * fVar2;
            auVar48._0_4_ = fVar115 * fVar1;
            auVar48._8_4_ = fVar101 * fVar3;
            auVar48._12_4_ = fVar102 * fVar27;
            auVar48._16_4_ = fVar103 * fVar9;
            auVar48._20_4_ = fVar104 * fVar10;
            auVar48._24_4_ = fVar105 * fVar11;
            auVar48._28_4_ = auVar75._28_4_;
            auVar74 = vfmadd213ps_fma(auVar28,local_2780,auVar48);
            auVar97 = vfmadd213ps_fma(local_2980,local_27a0,ZEXT1632(auVar74));
            auVar75 = vrcpps_avx(auVar81);
            auVar126._8_4_ = 0x3f800000;
            auVar126._0_8_ = 0x3f8000003f800000;
            auVar126._12_4_ = 0x3f800000;
            auVar126._16_4_ = 0x3f800000;
            auVar126._20_4_ = 0x3f800000;
            auVar126._24_4_ = 0x3f800000;
            auVar126._28_4_ = 0x3f800000;
            auVar74 = vfnmadd213ps_fma(auVar75,auVar81,auVar126);
            auVar74 = vfmadd132ps_fma(ZEXT1632(auVar74),auVar75,auVar75);
            local_26e0._28_4_ = 0x3f800000;
            local_26e0._0_28_ =
                 ZEXT1628(CONCAT412(auVar74._12_4_ * (auVar97._12_4_ + auVar97._12_4_),
                                    CONCAT48(auVar74._8_4_ * (auVar97._8_4_ + auVar97._8_4_),
                                             CONCAT44(auVar74._4_4_ *
                                                      (auVar97._4_4_ + auVar97._4_4_),
                                                      auVar74._0_4_ *
                                                      (auVar97._0_4_ + auVar97._0_4_)))));
            auVar108 = ZEXT3264(local_26e0);
            uVar128 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar95._4_4_ = uVar128;
            auVar95._0_4_ = uVar128;
            auVar95._8_4_ = uVar128;
            auVar95._12_4_ = uVar128;
            auVar95._16_4_ = uVar128;
            auVar95._20_4_ = uVar128;
            auVar95._24_4_ = uVar128;
            auVar95._28_4_ = uVar128;
            uVar128 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar131._4_4_ = uVar128;
            auVar131._0_4_ = uVar128;
            auVar131._8_4_ = uVar128;
            auVar131._12_4_ = uVar128;
            auVar131._16_4_ = uVar128;
            auVar131._20_4_ = uVar128;
            auVar131._24_4_ = uVar128;
            auVar131._28_4_ = uVar128;
            auVar113 = ZEXT3264(auVar131);
            auVar75 = vcmpps_avx(auVar95,local_26e0,2);
            auVar88 = vcmpps_avx(local_26e0,auVar131,2);
            auVar75 = vandps_avx(auVar88,auVar75);
            auVar74 = vpackssdw_avx(auVar75._0_16_,auVar75._16_16_);
            auVar86 = vpand_avx(auVar74,auVar86);
            auVar75 = vpmovsxwd_avx2(auVar86);
            if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar75 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar75 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar75 >> 0x7f,0) != '\0') ||
                  (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar75 >> 0xbf,0) != '\0') ||
                (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar75[0x1f] < '\0') {
              auVar75 = vcmpps_avx(auVar81,_DAT_01faff00,4);
              auVar74 = vpackssdw_avx(auVar75._0_16_,auVar75._16_16_);
              auVar86 = vpand_avx(auVar86,auVar74);
              local_2960 = vpmovsxwd_avx2(auVar86);
              if ((((((((local_2960 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_2960 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_2960 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_2960 >> 0x7f,0) != '\0') ||
                    (local_2960 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(local_2960 >> 0xbf,0) != '\0') ||
                  (local_2960 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  local_2960[0x1f] < '\0') {
                local_2800 = ZEXT1632(auVar73);
                local_2740 = local_2960;
                local_2660 = local_2500;
                pSVar63 = context->scene;
                auVar75 = vrcpps_avx(local_27c0);
                auVar118._8_4_ = 0x3f800000;
                auVar118._0_8_ = 0x3f8000003f800000;
                auVar118._12_4_ = 0x3f800000;
                auVar118._16_4_ = 0x3f800000;
                auVar118._20_4_ = 0x3f800000;
                auVar118._24_4_ = 0x3f800000;
                auVar118._28_4_ = 0x3f800000;
                auVar74 = vfnmadd213ps_fma(local_27c0,auVar75,auVar118);
                auVar74 = vfmadd132ps_fma(ZEXT1632(auVar74),auVar75,auVar75);
                auVar96._8_4_ = 0x219392ef;
                auVar96._0_8_ = 0x219392ef219392ef;
                auVar96._12_4_ = 0x219392ef;
                auVar96._16_4_ = 0x219392ef;
                auVar96._20_4_ = 0x219392ef;
                auVar96._24_4_ = 0x219392ef;
                auVar96._28_4_ = 0x219392ef;
                auVar75 = vcmpps_avx(local_24e0,auVar96,5);
                auVar75 = vandps_avx(auVar75,ZEXT1632(auVar74));
                auVar49._4_4_ = auVar73._4_4_ * auVar75._4_4_;
                auVar49._0_4_ = auVar73._0_4_ * auVar75._0_4_;
                auVar49._8_4_ = auVar73._8_4_ * auVar75._8_4_;
                auVar49._12_4_ = auVar73._12_4_ * auVar75._12_4_;
                auVar49._16_4_ = auVar75._16_4_ * 0.0;
                auVar49._20_4_ = auVar75._20_4_ * 0.0;
                auVar49._24_4_ = auVar75._24_4_ * 0.0;
                auVar49._28_4_ = 0;
                auVar88 = vminps_avx(auVar49,auVar118);
                auVar50._4_4_ = auVar83._4_4_ * auVar75._4_4_;
                auVar50._0_4_ = auVar83._0_4_ * auVar75._0_4_;
                auVar50._8_4_ = auVar83._8_4_ * auVar75._8_4_;
                auVar50._12_4_ = auVar83._12_4_ * auVar75._12_4_;
                auVar50._16_4_ = auVar75._16_4_ * 0.0;
                auVar50._20_4_ = auVar75._20_4_ * 0.0;
                auVar50._24_4_ = auVar75._24_4_ * 0.0;
                auVar50._28_4_ = local_2480._28_4_;
                auVar75 = vminps_avx(auVar50,auVar118);
                auVar81 = vsubps_avx(auVar118,auVar88);
                auVar28 = vsubps_avx(auVar118,auVar75);
                local_2700 = vblendvps_avx(auVar75,auVar81,local_2500);
                local_2720 = vblendvps_avx(auVar88,auVar28,local_2500);
                local_26c0[0] = local_27a0._0_4_ * (float)local_2520._0_4_;
                local_26c0[1] = local_27a0._4_4_ * (float)local_2520._4_4_;
                local_26c0[2] = local_27a0._8_4_ * fStack_2518;
                local_26c0[3] = local_27a0._12_4_ * fStack_2514;
                fStack_26b0 = local_27a0._16_4_ * fStack_2510;
                fStack_26ac = local_27a0._20_4_ * fStack_250c;
                fStack_26a8 = local_27a0._24_4_ * fStack_2508;
                uStack_26a4 = local_2720._28_4_;
                local_26a0[0] = (float)local_2520._0_4_ * local_2780._0_4_;
                local_26a0[1] = (float)local_2520._4_4_ * local_2780._4_4_;
                local_26a0[2] = fStack_2518 * local_2780._8_4_;
                local_26a0[3] = fStack_2514 * local_2780._12_4_;
                fStack_2690 = fStack_2510 * local_2780._16_4_;
                fStack_268c = fStack_250c * local_2780._20_4_;
                fStack_2688 = fStack_2508 * local_2780._24_4_;
                uStack_2684 = local_2700._28_4_;
                local_2680[0] = (float)local_2520._0_4_ * fVar115;
                local_2680[1] = (float)local_2520._4_4_ * fVar100;
                local_2680[2] = fStack_2518 * fVar101;
                local_2680[3] = fStack_2514 * fVar102;
                fStack_2670 = fStack_2510 * fVar103;
                fStack_266c = fStack_250c * fVar104;
                fStack_2668 = fStack_2508 * fVar105;
                uStack_2664 = uStack_2504;
                auVar75 = vpmovsxwd_avx2(auVar86);
                auVar85._8_4_ = 0x7f800000;
                auVar85._0_8_ = 0x7f8000007f800000;
                auVar85._12_4_ = 0x7f800000;
                auVar85._16_4_ = 0x7f800000;
                auVar85._20_4_ = 0x7f800000;
                auVar85._24_4_ = 0x7f800000;
                auVar85._28_4_ = 0x7f800000;
                auVar75 = vblendvps_avx(auVar85,local_26e0,auVar75);
                auVar88 = vshufps_avx(auVar75,auVar75,0xb1);
                auVar88 = vminps_avx(auVar75,auVar88);
                auVar81 = vshufpd_avx(auVar88,auVar88,5);
                auVar88 = vminps_avx(auVar88,auVar81);
                auVar81 = vpermpd_avx2(auVar88,0x4e);
                auVar88 = vminps_avx(auVar88,auVar81);
                auVar75 = vcmpps_avx(auVar75,auVar88,0);
                auVar73 = vpackssdw_avx(auVar75._0_16_,auVar75._16_16_);
                auVar73 = vpand_avx(auVar73,auVar86);
                auVar75 = vpmovsxwd_avx2(auVar73);
                auVar114 = ZEXT3264(auVar75);
                if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar75 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar75 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar75 >> 0x7f,0) == '\0') &&
                      (auVar75 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar75 >> 0xbf,0) == '\0') &&
                    (auVar75 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar75[0x1f]) {
                  auVar114 = ZEXT3264(local_2960);
                }
LAB_005e1ef9:
                uVar51 = vmovmskps_avx(auVar114._0_32_);
                uVar55 = 0;
                for (; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x80000000) {
                  uVar55 = uVar55 + 1;
                }
                uVar54 = CONCAT44(0,uVar55);
                uVar55 = *(uint *)((long)&local_23c0 + uVar54 * 4);
                pGVar7 = (pSVar63->geometries).items[uVar55].ptr;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  *(undefined4 *)(local_2960 + uVar54 * 4) = 0;
                }
                else {
                  local_2980._0_8_ = uVar54;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar128 = *(undefined4 *)(local_2720 + uVar54 * 4);
                    uVar5 = *(undefined4 *)(local_2700 + uVar54 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_26e0 + uVar54 * 4);
                    *(float *)(ray + k * 4 + 0xc0) = local_26c0[uVar54];
                    *(float *)(ray + k * 4 + 0xd0) = local_26a0[uVar54];
                    *(float *)(ray + k * 4 + 0xe0) = local_2680[uVar54];
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar128;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar5;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)((long)&local_28c0 + uVar54 * 4);
                    *(uint *)(ray + k * 4 + 0x120) = uVar55;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    goto LAB_005e2375;
                  }
                  uVar128 = *(undefined4 *)(local_2720 + uVar54 * 4);
                  local_2860._4_4_ = uVar128;
                  local_2860._0_4_ = uVar128;
                  local_2860._8_4_ = uVar128;
                  local_2860._12_4_ = uVar128;
                  local_2850 = *(undefined4 *)(local_2700 + uVar54 * 4);
                  local_2830._4_4_ = uVar55;
                  local_2830._0_4_ = uVar55;
                  local_2830._8_4_ = uVar55;
                  local_2830._12_4_ = uVar55;
                  uVar128 = *(undefined4 *)((long)&local_28c0 + uVar54 * 4);
                  auVar87._4_4_ = uVar128;
                  auVar87._0_4_ = uVar128;
                  auVar87._8_4_ = uVar128;
                  auVar87._12_4_ = uVar128;
                  fVar1 = local_26c0[uVar54];
                  fVar2 = local_26a0[uVar54];
                  local_2880._4_4_ = fVar2;
                  local_2880._0_4_ = fVar2;
                  local_2880._8_4_ = fVar2;
                  local_2880._12_4_ = fVar2;
                  fVar2 = local_2680[uVar54];
                  local_2870._4_4_ = fVar2;
                  local_2870._0_4_ = fVar2;
                  local_2870._8_4_ = fVar2;
                  local_2870._12_4_ = fVar2;
                  local_2890[0] = (RTCHitN)SUB41(fVar1,0);
                  local_2890[1] = (RTCHitN)(char)((uint)fVar1 >> 8);
                  local_2890[2] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
                  local_2890[3] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
                  local_2890[4] = (RTCHitN)SUB41(fVar1,0);
                  local_2890[5] = (RTCHitN)(char)((uint)fVar1 >> 8);
                  local_2890[6] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
                  local_2890[7] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
                  local_2890[8] = (RTCHitN)SUB41(fVar1,0);
                  local_2890[9] = (RTCHitN)(char)((uint)fVar1 >> 8);
                  local_2890[10] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
                  local_2890[0xb] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
                  local_2890[0xc] = (RTCHitN)SUB41(fVar1,0);
                  local_2890[0xd] = (RTCHitN)(char)((uint)fVar1 >> 8);
                  local_2890[0xe] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
                  local_2890[0xf] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
                  uStack_284c = local_2850;
                  uStack_2848 = local_2850;
                  uStack_2844 = local_2850;
                  local_2840 = auVar87;
                  vpcmpeqd_avx2(ZEXT1632(local_2860),ZEXT1632(local_2860));
                  uStack_281c = context->user->instID[0];
                  local_2820 = uStack_281c;
                  uStack_2818 = uStack_281c;
                  uStack_2814 = uStack_281c;
                  uStack_2810 = context->user->instPrimID[0];
                  uStack_280c = uStack_2810;
                  uStack_2808 = uStack_2810;
                  uStack_2804 = uStack_2810;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_26e0 + uVar54 * 4);
                  local_29e0 = *local_29d0;
                  local_29b0.valid = (int *)local_29e0;
                  local_29b0.geometryUserPtr = pGVar7->userPtr;
                  local_29b0.context = context->user;
                  local_29b0.hit = local_2890;
                  local_29b0.N = 4;
                  local_28e0 = auVar108._0_32_;
                  local_2900 = auVar113._0_32_;
                  local_2920._0_8_ = pSVar63;
                  local_29b0.ray = (RTCRayN *)ray;
                  if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar7->intersectionFilterN)(&local_29b0);
                    auVar113 = ZEXT3264(local_2900);
                    auVar108 = ZEXT3264(local_28e0);
                    pSVar63 = (Scene *)local_2920._0_8_;
                  }
                  if (local_29e0 == (undefined1  [16])0x0) {
                    auVar73 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar73 = auVar73 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var8)(&local_29b0);
                      auVar113 = ZEXT3264(local_2900);
                      auVar108 = ZEXT3264(local_28e0);
                      pSVar63 = (Scene *)local_2920._0_8_;
                    }
                    auVar83 = vpcmpeqd_avx(local_29e0,_DAT_01f7aa10);
                    auVar86 = vpcmpeqd_avx(auVar87,auVar87);
                    auVar73 = auVar83 ^ auVar86;
                    if (local_29e0 != (undefined1  [16])0x0) {
                      auVar83 = auVar83 ^ auVar86;
                      auVar86 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])local_29b0.hit);
                      *(undefined1 (*) [16])(local_29b0.ray + 0xc0) = auVar86;
                      auVar86 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])(local_29b0.hit + 0x10)
                                              );
                      *(undefined1 (*) [16])(local_29b0.ray + 0xd0) = auVar86;
                      auVar86 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])(local_29b0.hit + 0x20)
                                              );
                      *(undefined1 (*) [16])(local_29b0.ray + 0xe0) = auVar86;
                      auVar86 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])(local_29b0.hit + 0x30)
                                              );
                      *(undefined1 (*) [16])(local_29b0.ray + 0xf0) = auVar86;
                      auVar86 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])(local_29b0.hit + 0x40)
                                              );
                      *(undefined1 (*) [16])(local_29b0.ray + 0x100) = auVar86;
                      auVar86 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])(local_29b0.hit + 0x50)
                                              );
                      *(undefined1 (*) [16])(local_29b0.ray + 0x110) = auVar86;
                      auVar86 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])(local_29b0.hit + 0x60)
                                              );
                      *(undefined1 (*) [16])(local_29b0.ray + 0x120) = auVar86;
                      auVar86 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])(local_29b0.hit + 0x70)
                                              );
                      *(undefined1 (*) [16])(local_29b0.ray + 0x130) = auVar86;
                      auVar83 = vmaskmovps_avx(auVar83,*(undefined1 (*) [16])(local_29b0.hit + 0x80)
                                              );
                      *(undefined1 (*) [16])(local_29b0.ray + 0x140) = auVar83;
                    }
                  }
                  auVar68._8_8_ = 0x100000001;
                  auVar68._0_8_ = 0x100000001;
                  if ((auVar68 & auVar73) == (undefined1  [16])0x0) {
                    *(int *)(ray + k * 4 + 0x80) = auVar113._0_4_;
                  }
                  else {
                    auVar113 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                  }
                  *(undefined4 *)(local_2960 + local_2980._0_8_ * 4) = 0;
                  uVar128 = auVar113._0_4_;
                  auVar71._4_4_ = uVar128;
                  auVar71._0_4_ = uVar128;
                  auVar71._8_4_ = uVar128;
                  auVar71._12_4_ = uVar128;
                  auVar71._16_4_ = uVar128;
                  auVar71._20_4_ = uVar128;
                  auVar71._24_4_ = uVar128;
                  auVar71._28_4_ = uVar128;
                  auVar75 = vcmpps_avx(auVar108._0_32_,auVar71,2);
                  local_2960 = vandps_avx(auVar75,local_2960);
                }
                auVar114 = ZEXT3264(local_2960);
                if ((((((((local_2960 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_2960 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_2960 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_2960 >> 0x7f,0) == '\0') &&
                      (local_2960 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_2960 >> 0xbf,0) == '\0') &&
                    (local_2960 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_2960[0x1f]) goto LAB_005e2375;
                auVar82._8_4_ = 0x7f800000;
                auVar82._0_8_ = 0x7f8000007f800000;
                auVar82._12_4_ = 0x7f800000;
                auVar82._16_4_ = 0x7f800000;
                auVar82._20_4_ = 0x7f800000;
                auVar82._24_4_ = 0x7f800000;
                auVar82._28_4_ = 0x7f800000;
                auVar75 = vblendvps_avx(auVar82,auVar108._0_32_,local_2960);
                auVar88 = vshufps_avx(auVar75,auVar75,0xb1);
                auVar88 = vminps_avx(auVar75,auVar88);
                auVar81 = vshufpd_avx(auVar88,auVar88,5);
                auVar88 = vminps_avx(auVar88,auVar81);
                auVar81 = vpermpd_avx2(auVar88,0x4e);
                auVar88 = vminps_avx(auVar88,auVar81);
                auVar75 = vcmpps_avx(auVar75,auVar88,0);
                auVar88 = local_2960 & auVar75;
                if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar88 >> 0x7f,0) != '\0') ||
                      (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar88 >> 0xbf,0) != '\0') ||
                    (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar88[0x1f] < '\0') {
                  auVar75 = vandps_avx(auVar75,local_2960);
                  auVar114 = ZEXT3264(auVar75);
                }
                goto LAB_005e1ef9;
              }
            }
          }
LAB_005e2375:
          lVar61 = lVar61 + 1;
        } while (lVar61 != local_29c8);
      }
      uVar128 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar72 = ZEXT3264(CONCAT428(uVar128,CONCAT424(uVar128,CONCAT420(uVar128,CONCAT416(uVar128,
                                                  CONCAT412(uVar128,CONCAT48(uVar128,CONCAT44(
                                                  uVar128,uVar128))))))));
      auVar108 = ZEXT3264(local_2540);
      auVar113 = ZEXT3264(local_2560);
      auVar114 = ZEXT3264(local_2580);
      auVar119 = ZEXT3264(local_25a0);
      auVar127 = ZEXT3264(local_25c0);
      auVar132 = ZEXT3264(local_25e0);
      auVar133 = ZEXT3264(local_2600);
      auVar135 = ZEXT3264(local_2620);
      auVar137 = ZEXT3264(local_2640);
      auVar139 = ZEXT3264(local_2940);
    }
    if (pauVar52 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }